

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

xmlXPathObjectPtr xmlXPathCacheWrapString(xmlXPathContextPtr ctxt,xmlChar *val)

{
  void *pvVar1;
  long lVar2;
  xmlXPathObjectPtr pxVar3;
  int iVar4;
  xmlXPathObjectPtr ret_1;
  xmlXPathObjectPtr ret;
  xmlXPathContextCachePtr cache;
  xmlChar *val_local;
  xmlXPathContextPtr ctxt_local;
  
  if ((ctxt != (xmlXPathContextPtr)0x0) && (ctxt->cache != (void *)0x0)) {
    pvVar1 = ctxt->cache;
    if ((*(long *)((long)pvVar1 + 8) != 0) && (*(int *)(*(long *)((long)pvVar1 + 8) + 8) != 0)) {
      lVar2 = **(long **)((long)pvVar1 + 8);
      iVar4 = *(int *)(*(long *)((long)pvVar1 + 8) + 8) + -1;
      *(int *)(*(long *)((long)pvVar1 + 8) + 8) = iVar4;
      pxVar3 = *(xmlXPathObjectPtr *)(lVar2 + (long)iVar4 * 8);
      pxVar3->type = XPATH_STRING;
      pxVar3->stringval = val;
      return pxVar3;
    }
    if ((*(long *)((long)pvVar1 + 0x20) != 0) && (*(int *)(*(long *)((long)pvVar1 + 0x20) + 8) != 0)
       ) {
      lVar2 = **(long **)((long)pvVar1 + 0x20);
      iVar4 = *(int *)(*(long *)((long)pvVar1 + 0x20) + 8) + -1;
      *(int *)(*(long *)((long)pvVar1 + 0x20) + 8) = iVar4;
      pxVar3 = *(xmlXPathObjectPtr *)(lVar2 + (long)iVar4 * 8);
      pxVar3->type = XPATH_STRING;
      pxVar3->stringval = val;
      return pxVar3;
    }
  }
  pxVar3 = xmlXPathWrapString(val);
  return pxVar3;
}

Assistant:

static xmlXPathObjectPtr
xmlXPathCacheWrapString(xmlXPathContextPtr ctxt, xmlChar *val)
{
    if ((ctxt != NULL) && (ctxt->cache != NULL)) {
	xmlXPathContextCachePtr cache = (xmlXPathContextCachePtr) ctxt->cache;

	if ((cache->stringObjs != NULL) &&
	    (cache->stringObjs->number != 0))
	{

	    xmlXPathObjectPtr ret;

	    ret = (xmlXPathObjectPtr)
		cache->stringObjs->items[--cache->stringObjs->number];
	    ret->type = XPATH_STRING;
	    ret->stringval = val;
#ifdef XP_DEBUG_OBJ_USAGE
	    xmlXPathDebugObjUsageRequested(ctxt, XPATH_STRING);
#endif
	    return(ret);
	} else if ((cache->miscObjs != NULL) &&
	    (cache->miscObjs->number != 0))
	{
	    xmlXPathObjectPtr ret;
	    /*
	    * Fallback to misc-cache.
	    */
	    ret = (xmlXPathObjectPtr)
		cache->miscObjs->items[--cache->miscObjs->number];

	    ret->type = XPATH_STRING;
	    ret->stringval = val;
#ifdef XP_DEBUG_OBJ_USAGE
	    xmlXPathDebugObjUsageRequested(ctxt, XPATH_STRING);
#endif
	    return(ret);
	}
    }
    return(xmlXPathWrapString(val));
}